

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_code_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::Generate
          (SharedCodeGenerator *this,GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_file_list)

{
  FileDescriptor *this_00;
  bool bVar1;
  bool oss_runtime;
  int iVar2;
  pointer this_01;
  undefined4 extraout_var;
  Printer *this_02;
  pointer pZVar3;
  pointer pPVar4;
  ulong uVar5;
  undefined4 extraout_var_00;
  size_t extraout_RDX;
  Options *in_R8;
  char *pcVar6;
  string_view java_class_name;
  AlphaNum *local_498;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_458;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  info_output;
  string_view local_430;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_418;
  string_view local_410;
  string_view local_400;
  string_view local_3f0;
  Options local_3e0;
  byte local_38a;
  allocator<char> local_389;
  string local_388 [32];
  string_view local_368;
  string_view local_358;
  string_view local_348;
  string_view local_338;
  string_view local_328;
  string_view local_318;
  AlphaNum local_308;
  AlphaNum local_2d8;
  undefined1 local_2a8 [8];
  string info_full_path;
  AlphaNum local_258;
  undefined1 local_228 [8];
  string info_relative_path;
  unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
  printer;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratedCodeInfo annotations;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  AlphaNum local_188;
  AlphaNum local_158;
  undefined1 local_128 [8];
  string filename;
  string classname;
  undefined1 local_c8 [8];
  string package_dir;
  Options local_98;
  undefined1 local_48 [8];
  string java_package;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *annotation_file_list_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *file_list_local;
  GeneratorContext *context_local;
  SharedCodeGenerator *this_local;
  
  this_00 = this->file_;
  java_package.field_2._8_8_ = annotation_file_list;
  Options::Options(&local_98,&this->options_);
  FileJavaPackage_abi_cxx11_
            ((string *)local_48,(java *)this_00,(FileDescriptor *)0x1,SUB81(&local_98,0),in_R8);
  Options::~Options(&local_98);
  std::__cxx11::string::string((string *)(classname.field_2._M_local_buf + 8),(string *)local_48);
  JavaPackageToDir((string *)local_c8,(string *)((long)&classname.field_2 + 8));
  std::__cxx11::string::~string((string *)(classname.field_2._M_local_buf + 8));
  bVar1 = HasDescriptorMethods(this->file_,(bool)((this->options_).enforce_lite & 1));
  if (bVar1) {
    this_01 = std::
              unique_ptr<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
              ::operator->(&this->name_resolver_);
    ClassNameResolver::GetDescriptorClassName_abi_cxx11_
              ((string *)((long)&filename.field_2 + 8),this_01,this->file_);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_158,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_188,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&filename.field_2 + 8));
    absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&output,".java");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_128,(lts_20250127 *)&local_158,&local_188,(AlphaNum *)&output,
               (AlphaNum *)in_R8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(file_list,(value_type *)local_128);
    iVar2 = (*context->_vptr_GeneratorContext[2])(context,local_128);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
    ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
              ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                *)&annotations.field_0._impl_._cached_size_,(pointer)CONCAT44(extraout_var,iVar2));
    GeneratedCodeInfo::GeneratedCodeInfo
              ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
    protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::
    AnnotationProtoCollector
              ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)&printer,
               (GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
    this_02 = (Printer *)operator_new(0x130);
    pZVar3 = std::
             unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
             ::get((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                    *)&annotations.field_0._impl_._cached_size_);
    if (((this->options_).annotate_code & 1U) == 0) {
      local_498 = (AlphaNum *)0x0;
    }
    else {
      local_498 = (AlphaNum *)&printer;
    }
    protobuf::io::Printer::Printer(this_02,pZVar3,'$',(AnnotationCollector *)local_498);
    std::
    unique_ptr<google::protobuf::io::Printer,std::default_delete<google::protobuf::io::Printer>>::
    unique_ptr<std::default_delete<google::protobuf::io::Printer>,void>
              ((unique_ptr<google::protobuf::io::Printer,std::default_delete<google::protobuf::io::Printer>>
                *)(info_relative_path.field_2._M_local_buf + 8),this_02);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_258,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&filename.field_2 + 8));
    absl::lts_20250127::AlphaNum::AlphaNum
              ((AlphaNum *)((long)&info_full_path.field_2 + 8),".java.pb.meta");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_228,(lts_20250127 *)&local_258,
               (AlphaNum *)((long)&info_full_path.field_2 + 8),local_498);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_2d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_308,".pb.meta");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_2a8,(lts_20250127 *)&local_2d8,&local_308,local_498);
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                           *)((long)&info_relative_path.field_2 + 8));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_318,
               "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// NO CHECKED-IN PROTOBUF GENCODE\n// source: $filename$\n"
              );
    local_328 = FileDescriptor::name(this->file_);
    protobuf::io::Printer::Print<char[9],std::basic_string_view<char,std::char_traits<char>>>
              (pPVar4,local_318,(char (*) [9])"filename",&local_328);
    if (((this->options_).opensource_runtime & 1U) != 0) {
      pPVar4 = std::
               unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                             *)((long)&info_relative_path.field_2 + 8));
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_338,"// Protobuf Java Version: $protobuf_java_version$\n");
      protobuf::io::Printer::Print<char[22],char[11]>
                (pPVar4,local_338,(char (*) [22])"protobuf_java_version",(char (*) [11])"4.31.0-dev"
                );
    }
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                           *)((long)&info_relative_path.field_2 + 8));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_348,"\n");
    protobuf::io::Printer::Print<>(pPVar4,local_348);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pPVar4 = std::
               unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                             *)((long)&info_relative_path.field_2 + 8));
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_358,"package $package$;\n\n");
      protobuf::io::Printer::Print<char[8],std::__cxx11::string>
                (pPVar4,local_358,(char (*) [8])0x208ae53,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    }
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::get((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                    *)((long)&info_relative_path.field_2 + 8));
    local_38a = 0;
    if (((this->options_).annotate_code & 1U) == 0) {
      std::allocator<char>::allocator();
      local_38a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (local_388,anon_var_dwarf_37cdd0 + 5,&local_389);
    }
    else {
      std::__cxx11::string::string(local_388,(string *)local_228);
    }
    local_368 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_388);
    Options::Options(&local_3e0,&this->options_);
    PrintGeneratedAnnotation(pPVar4,'$',local_368,&local_3e0);
    Options::~Options(&local_3e0);
    std::__cxx11::string::~string(local_388);
    if ((local_38a & 1) != 0) {
      std::allocator<char>::~allocator(&local_389);
    }
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                           *)((long)&info_relative_path.field_2 + 8));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_3f0,
               "public final class $classname$ {\n  /* This variable is to be called by generated code only. It returns\n  * an incomplete descriptor for internal use only. */\n  public static final com.google.protobuf.Descriptors.FileDescriptor\n      descriptor;\n"
              );
    protobuf::io::Printer::Print<char[10],std::__cxx11::string>
              (pPVar4,local_3f0,(char (*) [10])0x1fb9081,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&filename.field_2 + 8));
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                           *)((long)&info_relative_path.field_2 + 8));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_400,"classname")
    ;
    local_410 = FileDescriptor::name(this->file_);
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_418);
    pcVar6 = local_410._M_str;
    protobuf::io::Printer::Annotate(pPVar4,local_400,local_410,local_418);
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                           *)((long)&info_relative_path.field_2 + 8));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_430,"  static {\n");
    protobuf::io::Printer::Print<>(pPVar4,local_430);
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                           *)((long)&info_relative_path.field_2 + 8));
    protobuf::io::Printer::Indent(pPVar4);
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                           *)((long)&info_relative_path.field_2 + 8));
    protobuf::io::Printer::Indent(pPVar4);
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::get((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                    *)((long)&info_relative_path.field_2 + 8));
    GenerateDescriptors(this,pPVar4);
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::get((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                    *)((long)&info_relative_path.field_2 + 8));
    bVar1 = (this->options_).opensource_runtime;
    oss_runtime = (bool)std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)(filename.field_2._M_local_buf + 8));
    java_class_name._M_str = pcVar6;
    java_class_name._M_len = extraout_RDX;
    PrintGencodeVersionValidator
              ((java *)pPVar4,(Printer *)(ulong)(bVar1 & 1),oss_runtime,java_class_name);
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                           *)((long)&info_relative_path.field_2 + 8));
    protobuf::io::Printer::Outdent(pPVar4);
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                           *)((long)&info_relative_path.field_2 + 8));
    protobuf::io::Printer::Outdent(pPVar4);
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                           *)((long)&info_relative_path.field_2 + 8));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&info_output,"  }\n}\n");
    protobuf::io::Printer::Print<>(pPVar4,_info_output);
    if (((this->options_).annotate_code & 1U) != 0) {
      iVar2 = (*context->_vptr_GeneratorContext[2])(context,local_2a8);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
      ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                  *)&local_458,(pointer)CONCAT44(extraout_var_00,iVar2));
      pZVar3 = std::
               unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
               ::get(&local_458);
      protobuf::MessageLite::SerializeToZeroCopyStream
                ((MessageLite *)&annotation_collector.annotation_proto_,pZVar3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)java_package.field_2._8_8_,(value_type *)local_2a8);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      ::~unique_ptr(&local_458);
    }
    std::
    unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>::
    reset((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
           *)((long)&info_relative_path.field_2 + 8),(pointer)0x0);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ::reset((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
             *)&annotations.field_0._impl_._cached_size_,(pointer)0x0);
    std::__cxx11::string::~string((string *)local_2a8);
    std::__cxx11::string::~string((string *)local_228);
    std::
    unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>::
    ~unique_ptr((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                 *)((long)&info_relative_path.field_2 + 8));
    protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::
    ~AnnotationProtoCollector
              ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)&printer);
    GeneratedCodeInfo::~GeneratedCodeInfo
              ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   *)&annotations.field_0._impl_._cached_size_);
    std::__cxx11::string::~string((string *)local_128);
    std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void SharedCodeGenerator::Generate(
    GeneratorContext* context, std::vector<std::string>* file_list,
    std::vector<std::string>* annotation_file_list) {
  std::string java_package = FileJavaPackage(file_, true, options_);
  std::string package_dir = JavaPackageToDir(java_package);

  if (HasDescriptorMethods(file_, options_.enforce_lite)) {
    // Generate descriptors.
    std::string classname = name_resolver_->GetDescriptorClassName(file_);
    std::string filename = absl::StrCat(package_dir, classname, ".java");
    file_list->push_back(filename);
    std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    std::unique_ptr<io::Printer> printer(new io::Printer(
        output.get(), '$',
        options_.annotate_code ? &annotation_collector : nullptr));
    std::string info_relative_path = absl::StrCat(classname, ".java.pb.meta");
    std::string info_full_path = absl::StrCat(filename, ".pb.meta");
    printer->Print(
        "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
        "// NO CHECKED-IN PROTOBUF "
        // Intentional line breaker
        "GENCODE\n"
        "// source: $filename$\n",
        "filename", file_->name());
    if (options_.opensource_runtime) {
      printer->Print("// Protobuf Java Version: $protobuf_java_version$\n",
                     "protobuf_java_version", PROTOBUF_JAVA_VERSION_STRING);
    }
    printer->Print("\n");
    if (!java_package.empty()) {
      printer->Print(
          "package $package$;\n"
          "\n",
          "package", java_package);
    }
    PrintGeneratedAnnotation(printer.get(), '$',
                             options_.annotate_code ? info_relative_path : "",
                             options_);


    printer->Print(

        "public final class $classname$ {\n"
        "  /* This variable is to be called by generated code only. It "
        "returns\n"
        "  * an incomplete descriptor for internal use only. */\n"
        "  public static final com.google.protobuf.Descriptors.FileDescriptor\n"
        "      descriptor;\n",
        "classname", classname);
    printer->Annotate("classname", file_->name());


    printer->Print("  static {\n");
    printer->Indent();
    printer->Indent();
    GenerateDescriptors(printer.get());
    PrintGencodeVersionValidator(printer.get(), options_.opensource_runtime,
                                 classname);
    printer->Outdent();
    printer->Outdent();
    printer->Print(
        "  }\n"
        "}\n");

    if (options_.annotate_code) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          context->Open(info_full_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
      annotation_file_list->push_back(info_full_path);
    }

    printer.reset();
    output.reset();
  }
}